

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap_opkill.cpp
# Opt level: O2

Status __thiscall spvtools::opt::WrapOpKill::Process(WrapOpKill *this)

{
  uint __line;
  bool bVar1;
  StructuredCFGAnalysis *this_00;
  Function *this_01;
  Status SVar2;
  __node_base _Var3;
  bool modified;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  func_to_process;
  
  modified = false;
  this_00 = IRContext::GetStructuredCFGAnalysis((this->super_Pass).context_);
  StructuredCFGAnalysis::FindFuncsCalledFromContinue(&func_to_process,this_00);
  for (_Var3 = func_to_process._M_h._M_before_begin; _Var3._M_nxt != (_Hash_node_base *)0x0;
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt) {
    this_01 = IRContext::GetFunction
                        ((this->super_Pass).context_,*(uint32_t *)&_Var3._M_nxt[1]._M_nxt);
    local_88._8_8_ = &modified;
    local_70 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/wrap_opkill.cpp:29:43)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/wrap_opkill.cpp:29:43)>
               ::_M_manager;
    local_88._M_unused._M_object = this;
    bVar1 = opt::Function::WhileEachInst
                      (this_01,(function<bool_(spvtools::opt::Instruction_*)> *)&local_88,false,
                       false);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    if (!bVar1) {
      SVar2 = Failure;
      goto LAB_0047b1de;
    }
  }
  if ((this->opkill_function_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
      _M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl != (Function *)0x0) {
    if ((modified & 1U) == 0) {
      __line = 0x30;
      goto LAB_0047b229;
    }
    IRContext::AddFunction((this->super_Pass).context_,&this->opkill_function_);
  }
  if ((this->opterminateinvocation_function_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
      _M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl != (Function *)0x0) {
    if ((modified & 1U) == 0) {
      __line = 0x35;
LAB_0047b229:
      __assert_fail("modified && \"The function should only be generated if something was modified.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/wrap_opkill.cpp"
                    ,__line,"virtual Pass::Status spvtools::opt::WrapOpKill::Process()");
    }
    IRContext::AddFunction((this->super_Pass).context_,&this->opterminateinvocation_function_);
  }
  SVar2 = modified & 1 ^ SuccessWithoutChange;
LAB_0047b1de:
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&func_to_process._M_h);
  return SVar2;
}

Assistant:

Pass::Status WrapOpKill::Process() {
  bool modified = false;

  auto func_to_process =
      context()->GetStructuredCFGAnalysis()->FindFuncsCalledFromContinue();
  for (uint32_t func_id : func_to_process) {
    Function* func = context()->GetFunction(func_id);
    bool successful = func->WhileEachInst([this, &modified](Instruction* inst) {
      const auto opcode = inst->opcode();
      if ((opcode == spv::Op::OpKill) ||
          (opcode == spv::Op::OpTerminateInvocation)) {
        modified = true;
        if (!ReplaceWithFunctionCall(inst)) {
          return false;
        }
      }
      return true;
    });

    if (!successful) {
      return Status::Failure;
    }
  }

  if (opkill_function_ != nullptr) {
    assert(modified &&
           "The function should only be generated if something was modified.");
    context()->AddFunction(std::move(opkill_function_));
  }
  if (opterminateinvocation_function_ != nullptr) {
    assert(modified &&
           "The function should only be generated if something was modified.");
    context()->AddFunction(std::move(opterminateinvocation_function_));
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}